

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesImpl<false,true,false>
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  double *in_RDX;
  long in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  V_Real vSum;
  double local_170;
  double local_158;
  double dStack_150;
  int local_11c;
  double local_108;
  double dStack_100;
  double local_b8;
  double derivative_1;
  double sumSquared;
  double sum;
  V_Real patternWeight;
  V_Real derivative;
  V_Real denominator;
  V_Real numerator;
  int k;
  V_Real vSumSquared;
  
  local_108 = 0.0;
  dStack_100 = 0.0;
  for (local_11c = 0; local_11c < *(int *)(in_RDI + 0x14) + -1; local_11c = local_11c + 2) {
    auVar1 = vdivpd_avx(*(undefined1 (*) [16])(*(long *)(in_RDI + 0x100) + (long)local_11c * 8),
                        *(undefined1 (*) [16])(*(long *)(in_RDI + 0xf8) + (long)local_11c * 8));
    pdVar2 = (double *)(*(long *)(in_RDI + 0x80) + (long)local_11c * 8);
    local_158 = auVar1._0_8_;
    dStack_150 = auVar1._8_8_;
    local_108 = local_158 * *pdVar2 + local_108;
    dStack_100 = dStack_150 * pdVar2[1] + dStack_100;
  }
  auVar1._8_8_ = dStack_100;
  auVar1._0_8_ = local_108;
  auVar1 = vpermilpd_avx(auVar1,1);
  local_b8 = auVar1._0_8_;
  local_170 = local_108 + local_b8;
  for (; local_11c < *(int *)(in_RDI + 0x14); local_11c = local_11c + 1) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(double *)(*(long *)(in_RDI + 0x100) + (long)local_11c * 8) /
                   *(double *)(*(long *)(in_RDI + 0xf8) + (long)local_11c * 8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_11c * 8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_170;
    auVar1 = vfmadd213sd_fma(auVar3,auVar4,auVar5);
    local_170 = auVar1._0_8_;
  }
  *in_RDX = local_170;
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    V_Real vSum = VEC_SETZERO();
    V_Real vSumSquared = VEC_SETZERO();

    int k = 0;
    for (; k < kPatternCount - 1; k += 2) {

        V_Real numerator = VEC_LOAD(grandNumeratorDerivTmp + k);
        V_Real denominator = VEC_LOAD(grandDenominatorDerivTmp + k);
        V_Real derivative = VEC_DIV(numerator, denominator);
        V_Real patternWeight = VEC_LOAD(gPatternWeights + k);

        if (DoDerivatives) {
            VEC_STOREU(outDerivatives + k, derivative);
        }

        if (DoSum) {
            vSum = VEC_MADD(derivative, patternWeight, vSum);
        }

        if (DoSumSquared) {
            derivative = VEC_MULT(derivative, derivative);
            vSumSquared = VEC_MADD(derivative, patternWeight, vSumSquared);
        }
    }

    double sum;
    double sumSquared;

    if (DoSum) {
        sum = _mm_cvtsd_f64(VEC_ADD(vSum, VEC_SWAP(vSum)));
    }

    if (DoSumSquared) {
        sumSquared = _mm_cvtsd_f64(VEC_ADD(vSumSquared, VEC_SWAP(vSumSquared)));
    }

    for (; k < kPatternCount; ++k) {
        double derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) {
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}